

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  bool bVar1;
  byte bVar2;
  int64_t iVar3;
  invalid_argument *this;
  Autotune autotune;
  ofstream ofs;
  Args *in_stack_00000348;
  Autotune *in_stack_00000350;
  string outputFileName;
  shared_ptr<fasttext::FastText> fasttext;
  Args a;
  Args *in_stack_fffffffffffffaa0;
  shared_ptr<fasttext::FastText> *in_stack_fffffffffffffaa8;
  Autotune *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  Args *in_stack_fffffffffffffaf0;
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [103];
  undefined1 local_449;
  string local_448 [32];
  undefined1 local_428 [64];
  Args *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffce8;
  FastText *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffd78;
  FastText *in_stack_fffffffffffffd80;
  Args *in_stack_fffffffffffffd88;
  FastText *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffdd8;
  FastText *in_stack_fffffffffffffde0;
  string local_208 [32];
  string local_1e8 [160];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb8;
  Args *in_stack_fffffffffffffec0;
  byte local_a0;
  byte local_9f;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffaf0);
  ::fasttext::Args::parseArgs(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::make_shared<fasttext::FastText>();
  std::__cxx11::string::string(local_1e8);
  bVar1 = ::fasttext::Args::hasAutotune((Args *)0x169460);
  if (bVar1) {
    iVar3 = ::fasttext::Args::getAutotuneModelSize(in_stack_fffffffffffffc18);
    if (((double)iVar3 != -1.0) || (NAN((double)iVar3))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                     in_stack_fffffffffffffac0);
      std::__cxx11::string::operator=(local_1e8,local_208);
      std::__cxx11::string::~string(local_208);
      goto LAB_00169557;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 in_stack_fffffffffffffac0);
  std::__cxx11::string::operator=(local_1e8,(string *)&stack0xfffffffffffffdd8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
LAB_00169557:
  std::ofstream::ofstream(local_428,local_1e8,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ofstream::close();
    bVar1 = ::fasttext::Args::hasAutotune((Args *)0x169689);
    if (bVar1) {
      ::fasttext::Autotune::Autotune(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      ::fasttext::Autotune::train(in_stack_00000350,in_stack_00000348);
      ::fasttext::Autotune::~Autotune((Autotune *)in_stack_fffffffffffffaa0);
    }
    else {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x169709);
      ::fasttext::FastText::train(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16972a);
    ::fasttext::FastText::saveModel(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x169749);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_fffffffffffffac8),in_stack_fffffffffffffac0);
    ::fasttext::FastText::saveVectors(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_4b0);
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16979a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_fffffffffffffac8),in_stack_fffffffffffffac0);
    ::fasttext::FastText::saveVectorsMod(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_4d0);
    if ((local_9f & 1) != 0) {
      in_stack_fffffffffffffaa0 =
           (Args *)std::
                   __shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1697f9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,in_stack_fffffffffffffac8),in_stack_fffffffffffffac0);
      ::fasttext::FastText::saveSubWordVectors(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_4f0);
    }
    if ((local_a0 & 1) != 0) {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1698bc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,in_stack_fffffffffffffac8),in_stack_fffffffffffffac0);
      ::fasttext::FastText::saveOutput(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffaf0);
    }
    std::ofstream::~ofstream(local_428);
    std::__cxx11::string::~string(local_1e8);
    std::shared_ptr<fasttext::FastText>::~shared_ptr((shared_ptr<fasttext::FastText> *)0x16993e);
    ::fasttext::Args::~Args(in_stack_fffffffffffffaa0);
    return;
  }
  local_449 = 1;
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffac8),(char *)this);
  std::invalid_argument::invalid_argument(this,local_448);
  local_449 = 0;
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext);
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  fasttext->saveVectorsMod(a.output + "_mod.vec");
  if (a.saveSubwords) {
    fasttext->saveSubWordVectors(a.output + "_subwords.vec");
  }
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}